

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flying_cheat.cc
# Opt level: O0

void __thiscall FlyingCheat::disable(FlyingCheat *this)

{
  long *plVar1;
  ostream *poVar2;
  long local_38;
  Player *player;
  ClientWorld *world;
  FlyingCheat *this_local;
  
  std::atomic<bool>::operator=(&(this->super_Cheat).active,false);
  plVar1 = (long *)dlsym(0xffffffffffffffff,"GameWorld");
  if (*plVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Couldn\'t locate \'GameWorld\' symbol");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_38 = *(long *)(*plVar1 + 0xd8);
    if (local_38 == 0) {
      local_38 = 0;
    }
    else {
      local_38 = local_38 + -0xa8;
    }
    *(float *)(local_38 + 0x2e4) = this->m_jumpSpeed;
    *(float *)(local_38 + 0x2e8) = this->m_jumpHoldTime;
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&module_name_abi_cxx11_);
    poVar2 = std::operator<<(poVar2," disabled");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void FlyingCheat::disable()
{
    this->active = false;
    // Get the game world object
    ClientWorld *world = *((ClientWorld**)(dlsym(RTLD_NEXT, "GameWorld")));
    if (world == NULL) {
        std::cerr << "Couldn't locate 'GameWorld' symbol" << std::endl;
        return;
    }

    // Reset
    Player *player = (Player *)(world->m_activePlayer.m_object); 
    player->m_jumpSpeed = this->m_jumpSpeed;
    player->m_jumpHoldTime = this->m_jumpHoldTime;

    std::cout << module_name << " disabled" << std::endl;
}